

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O1

bool __thiscall CCNR::ls_solver::parse_arguments(ls_solver *this,int argc,char **argv)

{
  char *pcVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  bool bVar5;
  
  if (argc < 2) {
LAB_0012dd4d:
    bVar5 = false;
  }
  else {
    iVar4 = 1;
    bVar5 = false;
    do {
      pcVar1 = argv[iVar4];
      iVar3 = strcmp(pcVar1,"-inst");
      if (iVar3 == 0) {
        iVar4 = iVar4 + 1;
        if (argc <= iVar4) goto LAB_0012dd4d;
        pcVar1 = argv[iVar4];
        pcVar2 = (char *)(this->_inst_file)._M_string_length;
        strlen(pcVar1);
        std::__cxx11::string::_M_replace((ulong)this,0,pcVar2,(ulong)pcVar1);
        bVar5 = true;
      }
      else {
        iVar3 = strcmp(pcVar1,"-seed");
        if (iVar3 == 0) {
          iVar4 = iVar4 + 1;
          if (argc <= iVar4) goto LAB_0012dd4d;
          __isoc99_sscanf(argv[iVar4],"%d",&this->_random_seed);
        }
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < argc);
  }
  return bVar5;
}

Assistant:

bool ls_solver::parse_arguments(int argc, char **argv)
{
    bool flag_inst = false;
    for (int i = 1; i < argc; i++) {
        if (strcmp(argv[i], "-inst") == 0) {
            i++;
            if (i >= argc) return false;
            _inst_file = argv[i];
            flag_inst = true;
            continue;
        } else if (strcmp(argv[i], "-seed") == 0) {
            i++;
            if (i >= argc) return false;
            sscanf(argv[i], "%d", &_random_seed);
            continue;
        }
    }
    if (flag_inst)
        return true;
    else
        return false;
}